

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedObjectFileCreation.cpp
# Opt level: O3

LinkedObjectFile *
to_linked_object_file
          (LinkedObjectFile *__return_storage_ptr__,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *data,string *name)

{
  short sVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *name_00;
  bool bVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  uint dest_segment;
  uint32_t uVar11;
  long lVar12;
  Config *pCVar13;
  ulong uVar14;
  size_t sVar15;
  TypeInfo *pTVar16;
  byte bVar17;
  uint uVar18;
  pointer puVar19;
  ulong uVar20;
  byte bVar21;
  uint uVar22;
  uint32_t *puVar23;
  uint uVar24;
  Kind kind;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  int *piVar28;
  pointer puVar29;
  int *piVar30;
  uint uVar31;
  SymbolLinkKind SVar32;
  pointer puVar33;
  uint32_t segment_link_offsets [3];
  uint32_t segment_data_offsets [3];
  uint32_t segment_link_ends [3];
  allocator local_a9;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_a8;
  string local_a0;
  ulong local_80;
  ulong local_78;
  string *local_70;
  uint local_68 [6];
  int *local_50;
  int local_44 [3];
  int *local_38;
  
  (__return_storage_ptr__->stats).decoded_ops = 0;
  (__return_storage_ptr__->stats).n_fp_reg_use = 0;
  *(undefined8 *)&(__return_storage_ptr__->stats).n_fp_reg_use_resolved = 0;
  (__return_storage_ptr__->stats).data_bytes = 0;
  (__return_storage_ptr__->stats).code_bytes = 0;
  (__return_storage_ptr__->stats).function_count = 0;
  (__return_storage_ptr__->stats).decoded_ops = 0;
  (__return_storage_ptr__->stats).v3_link_bytes = 0;
  (__return_storage_ptr__->stats).v3_symbol_count = 0;
  (__return_storage_ptr__->stats).v3_symbol_link_offset = 0;
  (__return_storage_ptr__->stats).v3_symbol_link_word = 0;
  (__return_storage_ptr__->stats).v3_pointers = 0;
  (__return_storage_ptr__->stats).v3_split_pointers = 0;
  (__return_storage_ptr__->stats).v3_word_pointers = 0;
  (__return_storage_ptr__->stats).v3_pointer_seeks = 0;
  (__return_storage_ptr__->stats).total_v2_link_bytes = 0;
  (__return_storage_ptr__->stats).total_v2_symbol_links = 0;
  (__return_storage_ptr__->stats).total_v2_symbol_count = 0;
  (__return_storage_ptr__->stats).v3_code_bytes = 0;
  (__return_storage_ptr__->stats).total_code_bytes = 0;
  (__return_storage_ptr__->stats).total_v2_code_bytes = 0;
  (__return_storage_ptr__->stats).total_v2_pointers = 0;
  (__return_storage_ptr__->stats).total_v2_pointer_seeks = 0;
  (__return_storage_ptr__->words_by_seg).
  super__Vector_base<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->words_by_seg).
  super__Vector_base<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->words_by_seg).
  super__Vector_base<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->offset_of_data_zone_by_seg).
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (__return_storage_ptr__->offset_of_data_zone_by_seg).
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (__return_storage_ptr__->offset_of_data_zone_by_seg).
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->functions_by_seg).
  super__Vector_base<std::vector<Function,_std::allocator<Function>_>,_std::allocator<std::vector<Function,_std::allocator<Function>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->functions_by_seg).
  super__Vector_base<std::vector<Function,_std::allocator<Function>_>,_std::allocator<std::vector<Function,_std::allocator<Function>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->functions_by_seg).
  super__Vector_base<std::vector<Function,_std::allocator<Function>_>,_std::allocator<std::vector<Function,_std::allocator<Function>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->labels).super__Vector_base<Label,_std::allocator<Label>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->labels).super__Vector_base<Label,_std::allocator<Label>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->labels).super__Vector_base<Label,_std::allocator<Label>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->label_per_seg_by_offset).
  super__Vector_base<std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::allocator<std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->label_per_seg_by_offset).
  super__Vector_base<std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::allocator<std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->label_per_seg_by_offset).
  super__Vector_base<std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::allocator<std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  piVar28 = (int *)(data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                   .super__Vector_impl_data._M_start;
  uVar20 = (long)(data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                 super__Vector_impl_data._M_finish - (long)piVar28;
  local_70 = name;
  if (uVar20 == 0) {
    uVar25 = 0;
    goto LAB_0012c3bc;
  }
  sVar1 = (short)piVar28[2];
  local_a8 = data;
  local_38 = piVar28;
  if (sVar1 == 5) {
    if ((char)piVar28[5] == '\x01') {
      printf("abandon %s!\n",(name->_M_dataplus)._M_p);
    }
    else {
      if (*piVar28 != 0) {
        __assert_fail("header->type_tag == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                      ,0x18a,
                      "void link_v5(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                     );
      }
      iVar7 = std::__cxx11::string::compare((char *)name);
      if (iVar7 != 0) {
        __assert_fail("name == header->name",
                      "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                      ,0x18b,
                      "void link_v5(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                     );
      }
      if ((char)piVar28[5] != '\x03') {
        __assert_fail("header->n_segments == 3",
                      "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                      ,0x18c,
                      "void link_v5(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                     );
      }
      if (piVar28[3] != 0x50) {
        __assert_fail("header->pad == 0x50",
                      "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                      ,0x18d,
                      "void link_v5(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                     );
      }
      if (piVar28[1] - piVar28[4] != 0x50) {
        __assert_fail("header->length_to_get_to_code - header->link_length == 0x50",
                      "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                      ,0x18e,
                      "void link_v5(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                     );
      }
      LinkedObjectFile::set_segment_count(__return_storage_ptr__,3);
      iVar7 = piVar28[1];
      piVar30 = piVar28 + 0x14;
      lVar12 = 0;
      do {
        *(int *)((long)local_68 + lVar12 + 0xc) = piVar28[lVar12 + 0x15] + iVar7;
        *(int *)((long)local_68 + lVar12) = piVar30[lVar12] + 0x50;
        if (piVar28[lVar12 + 0x17] != 1) {
          __assert_fail("header->segment_info[i].magic == 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                        ,0x1a6,
                        "void link_v5(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                       );
        }
        lVar12 = lVar12 + 4;
      } while (lVar12 != 0xc);
      lVar12 = 0;
      while (lVar12 != 8) {
        lVar3 = lVar12 + 0xc;
        lVar2 = lVar12 + 0x16;
        lVar4 = lVar12 + 0x10;
        lVar12 = lVar12 + 4;
        if ((*(int *)((long)local_68 + lVar3) + piVar28[lVar2] + 0xfU & 0xfffffff0) !=
            *(uint *)((long)local_68 + lVar4)) {
          __assert_fail("align16(segment_data_offsets[i] + header->segment_info[i].size) == segment_data_offsets[i + 1]"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                        ,0x1ac,
                        "void link_v5(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                       );
        }
      }
      if ((long)(data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_start !=
          (ulong)(local_68[5] + piVar28[0x1e] + 0xf & 0xfffffff0)) {
        __assert_fail("align16(segment_data_offsets[2] + header->segment_info[2].size) == data.size()"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                      ,0x1ae,
                      "void link_v5(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                     );
      }
      uVar20 = 2;
      local_50 = piVar30;
      do {
        uVar24 = piVar30[uVar20 * 4 + 2];
        uVar25 = uVar20;
        if (uVar24 != 0) {
          puVar23 = &(__return_storage_ptr__->stats).v3_code_bytes;
          *puVar23 = *puVar23 + uVar24;
          uVar31 = uVar24;
          bVar6 = false;
          do {
            bVar5 = bVar6;
            uVar22 = uVar31 & 3;
            uVar31 = uVar31 + 1;
            bVar6 = true;
          } while (uVar22 != 0);
          local_78 = uVar20;
          if (bVar5) {
            printf("Adjusted the size of segment %d in %s, this is fine, but rare (and may indicate a bigger problem if it happens often)\n"
                   ,uVar20,(local_70->_M_dataplus)._M_p);
          }
          uVar31 = local_68[local_78 + 3];
          uVar26 = (ulong)uVar31;
          if ((uVar31 & 3) != 0) {
            __assert_fail("(data_ptr % 4) == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                          ,0x1cc,
                          "void link_v5(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                         );
          }
          puVar29 = (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          puVar33 = (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_finish;
          uVar20 = (long)puVar33 - (long)puVar29;
          uVar25 = uVar26;
          if (uVar20 <= uVar26) goto LAB_0012c3bc;
          uVar22 = uVar31 - 4;
          uVar25 = (ulong)((-uVar24 & 3) + uVar24 + uVar22);
          if (uVar20 <= uVar25) goto LAB_0012c3bc;
          uVar24 = local_68[local_78];
          uVar14 = (ulong)uVar24;
          iVar7 = (int)local_78;
          if (puVar29 + uVar26 < puVar29 + uVar25 + 4) {
            puVar33 = puVar29 + (uVar26 - 4);
            do {
              LinkedObjectFile::push_back_word_to_segment
                        (__return_storage_ptr__,*(uint32_t *)(puVar33 + 4),iVar7);
              puVar33 = puVar33 + 4;
            } while (puVar33 < puVar29 + uVar25);
            puVar29 = (local_a8->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_start;
            puVar33 = (local_a8->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_finish;
            uVar20 = (long)puVar33 - (long)puVar29;
          }
          uVar25 = uVar14;
          if (uVar20 <= uVar14) goto LAB_0012c3bc;
          if (puVar29[uVar14] != '\0') {
            uVar24 = 0;
            do {
              uVar20 = (long)puVar33 - (long)puVar29;
              local_80 = CONCAT44(local_80._4_4_,uVar24);
              uVar25 = uVar14;
              if ((uVar24 & 1) == 0) {
                if (uVar20 <= uVar14) goto LAB_0012c3bc;
                uVar22 = uVar22 + (uint)puVar29[uVar14] * 4;
                puVar23 = &(__return_storage_ptr__->stats).v3_pointer_seeks;
                *puVar23 = *puVar23 + 1;
              }
              else {
                if (uVar20 <= uVar14) goto LAB_0012c3bc;
                if (puVar29[uVar14] != '\0') {
                  uVar24 = 0;
                  do {
                    puVar23 = &(__return_storage_ptr__->stats).v3_pointers;
                    *puVar23 = *puVar23 + 1;
                    uVar25 = (ulong)uVar22;
                    if (uVar20 <= uVar25) goto LAB_0012c3bc;
                    uVar18 = *(uint *)(puVar29 + uVar25);
                    if (uVar18 < 0x1000000) {
                      puVar23 = &(__return_storage_ptr__->stats).v3_word_pointers;
                      *puVar23 = *puVar23 + 1;
                      bVar6 = LinkedObjectFile::pointer_link_word
                                        (__return_storage_ptr__,iVar7,-uVar31 + uVar22,iVar7,uVar18)
                      ;
                      if (!bVar6) {
                        printf("WARNING bad pointer_link_word (2) in %s\n",
                               (local_70->_M_dataplus)._M_p);
                      }
                    }
                    else {
                      puVar23 = &(__return_storage_ptr__->stats).v3_split_pointers;
                      *puVar23 = *puVar23 + 1;
                      uVar9 = uVar18 >> 0xc & 0xf;
                      if (uVar9 == 0) {
                        __assert_fail("lo_hi_offset",
                                      "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                                      ,0x1ec,
                                      "void link_v5(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                                     );
                      }
                      dest_segment = uVar18 >> 8 & 0xf;
                      if (2 < dest_segment) {
                        __assert_fail("dest_seg < 3",
                                      "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                                      ,0x1ed,
                                      "void link_v5(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                                     );
                      }
                      uVar25 = (ulong)(uVar22 + uVar9 * 4);
                      if (uVar20 <= uVar25) goto LAB_0012c3bc;
                      iVar8 = -uVar31 + uVar22;
                      LinkedObjectFile::pointer_link_split_word
                                (__return_storage_ptr__,iVar7,iVar8,uVar9 * 4 + iVar8,dest_segment,
                                 (uVar18 & 0xff) << 0x10 | (uint)*(ushort *)(puVar29 + uVar25));
                    }
                    puVar29 = (local_a8->
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                              _M_impl.super__Vector_impl_data._M_start;
                    puVar33 = (local_a8->
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                              _M_impl.super__Vector_impl_data._M_finish;
                    uVar20 = (long)puVar33 - (long)puVar29;
                    uVar25 = uVar14;
                    if (uVar20 <= uVar14) goto LAB_0012c3bc;
                    uVar24 = uVar24 + 1;
                    uVar22 = uVar22 + 4;
                  } while (uVar24 < puVar29[uVar14]);
                }
              }
              uVar24 = (int)uVar14 + 1;
              uVar25 = (ulong)uVar24;
              if (puVar29[uVar14] == 0xff) {
                if (uVar20 <= uVar25) goto LAB_0012c3bc;
                bVar6 = puVar29[uVar25] == '\0';
                if (bVar6) {
                  uVar25 = (ulong)((int)uVar14 + 2);
                }
              }
              else {
                if (uVar20 <= uVar25) goto LAB_0012c3bc;
                bVar6 = true;
                if (puVar29[uVar25] == '\0') break;
              }
              uVar24 = CONCAT31((int3)(local_80 >> 8),(byte)local_80 ^ bVar6);
              uVar14 = uVar25;
            } while( true );
          }
          data = local_a8;
          uVar26 = (ulong)(uVar24 + 1);
          uVar25 = uVar26;
          if (uVar20 <= uVar26) goto LAB_0012c3bc;
          bVar17 = puVar29[uVar26];
          while (iVar7 = (int)uVar26, bVar17 != 0) {
            uVar20 = (long)puVar33 - (long)puVar29;
            uVar25 = uVar26;
            if (uVar20 <= uVar26) goto LAB_0012c3bc;
            if ((char)bVar17 < '\0') {
              if ((~bVar17 & 0x3f) == 0) {
                __assert_fail("false",
                              "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                              ,0x225,
                              "void link_v5(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                             );
              }
              uVar25 = (ulong)(iVar7 + 3);
              if (uVar20 <= uVar25) goto LAB_0012c3bc;
              puVar29 = puVar29 + uVar25;
              sVar15 = strlen((char *)puVar29);
              iVar8 = (int)sVar15;
              SVar32 = TYPE;
            }
            else {
              uVar25 = (ulong)(iVar7 + 3);
              if (uVar20 <= uVar25) goto LAB_0012c3bc;
              puVar29 = puVar29 + uVar25;
              sVar15 = strlen((char *)puVar29);
              local_a0.field_2._M_allocated_capacity._0_4_ = 0x706d655f;
              local_a0._M_string_length = 7;
              local_a0.field_2._M_allocated_capacity._4_4_ = 0x5f7974;
              local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
              iVar10 = std::__cxx11::string::compare((char *)&local_a0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
                operator_delete(local_a0._M_dataplus._M_p,
                                CONCAT44(local_a0.field_2._M_allocated_capacity._4_4_,
                                         local_a0.field_2._M_allocated_capacity._0_4_) + 1);
              }
              iVar8 = (int)sVar15;
              SVar32 = (uint)(iVar10 != 0) * 2;
            }
            uVar11 = c_symlink2(__return_storage_ptr__,data,uVar31,iVar7 + iVar8 + 4,SVar32,
                                (char *)puVar29,(int)local_78);
            uVar26 = (ulong)uVar11;
            uVar25 = (ulong)uVar11;
            puVar29 = (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_start;
            puVar33 = (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_finish;
            uVar20 = (long)puVar33 - (long)puVar29;
            if (uVar20 <= uVar25) goto LAB_0012c3bc;
            bVar17 = puVar29[uVar25];
          }
          local_44[local_78] = iVar7;
          uVar25 = local_78;
          piVar28 = local_38;
          piVar30 = local_50;
        }
        uVar20 = uVar25 - 1;
      } while (uVar25 != 0);
      if (local_68[0] != 0x80) {
        __assert_fail("segment_link_offsets[0] == 128",
                      "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                      ,0x23b,
                      "void link_v5(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                     );
      }
      if (piVar28[0x16] == 0) {
        local_44[0] = 0x82;
        if (local_68[1] != 0x82) {
          __assert_fail("segment_link_offsets[0] + 2 == segment_link_offsets[1]",
                        "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                        ,0x240,
                        "void link_v5(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                       );
        }
      }
      else {
        local_44[0] = local_44[0] + 1;
        if (local_44[0] != local_68[1]) {
          __assert_fail("segment_link_ends[0] + 1 == segment_link_offsets[1]",
                        "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                        ,0x23e,
                        "void link_v5(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                       );
        }
      }
      if (piVar28[0x1a] == 0) {
        if (local_44[0] + 2 != local_68[2]) {
          __assert_fail("segment_link_offsets[1] + 2 == segment_link_offsets[2]",
                        "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                        ,0x246,
                        "void link_v5(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                       );
        }
      }
      else if (local_44[1] + 1 != local_68[2]) {
        __assert_fail("segment_link_ends[1] + 1 == segment_link_offsets[2]",
                      "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                      ,0x244,
                      "void link_v5(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                     );
      }
      if ((local_44[2] + 0x11U & 0xfffffff0) != local_68[3]) {
        __assert_fail("align16(segment_link_ends[2] + 2) == segment_data_offsets[0]",
                      "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                      ,0x249,
                      "void link_v5(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                     );
      }
    }
    return __return_storage_ptr__;
  }
  if (sVar1 != 4) {
    if (sVar1 != 3) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                    ,0x319,
                    "LinkedObjectFile to_linked_object_file(const std::vector<uint8_t> &, const std::string &)"
                   );
    }
    if (*piVar28 != 0) {
      __assert_fail("header->type_tag == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                    ,0x311,
                    "LinkedObjectFile to_linked_object_file(const std::vector<uint8_t> &, const std::string &)"
                   );
    }
    iVar7 = std::__cxx11::string::compare((char *)name);
    if (iVar7 != 0) {
      __assert_fail("name == header->name",
                    "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                    ,0x250,
                    "void link_v3(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                   );
    }
    if (piVar28[3] != 3) {
      __assert_fail("header->segments == 3",
                    "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                    ,0x251,
                    "void link_v3(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                   );
    }
    LinkedObjectFile::set_segment_count(__return_storage_ptr__,3);
    lVar12 = -1;
    do {
      lVar2 = lVar12 + 0x11;
      lVar12 = lVar12 + 1;
    } while (*(char *)((long)piVar28 + lVar2) != '\0');
    for (; lVar12 < 0x40; lVar12 = lVar12 + 1) {
      if (*(char *)((long)piVar28 + lVar12 + 0x10) != '\0') {
        __assert_fail("!*ptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                      ,0x17d,"void assert_string_empty_after(const char *, int)");
      }
    }
    local_50 = piVar28 + 0x14;
    lVar12 = 0;
    do {
      if (*(int *)((long)piVar28 + lVar12 + 0x5c) != 0) {
        __assert_fail("header->segment_info[i].magic == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                      ,599,
                      "void link_v3(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                     );
      }
      lVar12 = lVar12 + 0x10;
    } while (lVar12 != 0x30);
    iVar7 = piVar28[1];
    puVar23 = &(__return_storage_ptr__->stats).v3_link_bytes;
    *puVar23 = *puVar23 + iVar7;
    lVar12 = 0;
    do {
      *(int *)((long)local_68 + lVar12 + 0xc) = piVar28[lVar12 + 0x15] + iVar7;
      *(int *)((long)local_68 + lVar12) = piVar28[lVar12 + 0x14];
      lVar12 = lVar12 + 4;
    } while (lVar12 != 0xc);
    lVar12 = 0;
    while (lVar12 != 8) {
      lVar3 = lVar12 + 0xc;
      lVar2 = lVar12 + 0x16;
      lVar4 = lVar12 + 0x10;
      lVar12 = lVar12 + 4;
      if ((*(int *)((long)local_68 + lVar3) + piVar28[lVar2] + 0xfU & 0xfffffff0) !=
          *(uint *)((long)local_68 + lVar4)) {
        __assert_fail("align16(segment_data_offsets[i] + header->segment_info[i].size) == segment_data_offsets[i + 1]"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                      ,0x26b,
                      "void link_v3(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                     );
      }
    }
    if ((long)(data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_start !=
        (ulong)(local_68[5] + piVar28[0x1e] + 0xf & 0xfffffff0)) {
      __assert_fail("align16(segment_data_offsets[2] + header->segment_info[2].size) == data.size()"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                    ,0x26d,
                    "void link_v3(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                   );
    }
    uVar26 = 2;
    do {
      uVar24 = local_50[uVar26 * 4 + 2];
      if (uVar24 != 0) {
        puVar23 = &(__return_storage_ptr__->stats).v3_code_bytes;
        *puVar23 = *puVar23 + uVar24;
        pCVar13 = get_config();
        iVar7 = (int)uVar26;
        if (pCVar13->game_version == 1) {
          iVar8 = std::__cxx11::string::compare((char *)local_70);
          uVar24 = uVar24 + (iVar7 == 0 && iVar8 == 0);
        }
        pCVar13 = get_config();
        if (pCVar13->game_version == 2) {
          uVar31 = uVar24;
          bVar6 = false;
          do {
            bVar5 = bVar6;
            uVar22 = uVar31 & 3;
            uVar31 = uVar31 + 1;
            bVar6 = true;
          } while (uVar22 != 0);
          uVar24 = (-uVar24 & 3) + uVar24;
          if (bVar5) {
            printf("Adjusted the size of segment %d in %s, this is fine, but rare (and may indicate a bigger problem if it happens often)\n"
                   ,uVar26 & 0xffffffff,(local_70->_M_dataplus)._M_p);
          }
        }
        uVar31 = local_68[uVar26 + 3];
        uVar14 = (ulong)uVar31;
        if ((uVar31 & 3) != 0) {
          __assert_fail("(data_ptr % 4) == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                        ,0x294,
                        "void link_v3(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                       );
        }
        local_80 = uVar14;
        if ((uVar24 & 3) != 0) {
          __assert_fail("(segment_size % 4) == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                        ,0x295,
                        "void link_v3(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                       );
        }
        puVar33 = (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        puVar29 = (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                  super__Vector_impl_data._M_finish;
        uVar20 = (long)puVar29 - (long)puVar33;
        uVar25 = uVar14;
        if (uVar20 <= uVar14) goto LAB_0012c3bc;
        uVar31 = uVar31 - 4;
        uVar25 = (ulong)(uVar24 + uVar31);
        if (uVar20 <= uVar25) goto LAB_0012c3bc;
        uVar24 = local_68[uVar26];
        uVar27 = (ulong)uVar24;
        if (puVar33 + uVar14 < puVar33 + uVar25 + 4) {
          puVar29 = puVar33 + (uVar14 - 4);
          do {
            LinkedObjectFile::push_back_word_to_segment
                      (__return_storage_ptr__,*(uint32_t *)(puVar29 + 4),iVar7);
            puVar29 = puVar29 + 4;
          } while (puVar29 < puVar33 + uVar25);
          puVar33 = (local_a8->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          puVar29 = (local_a8->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_finish;
          uVar20 = (long)puVar29 - (long)puVar33;
        }
        uVar25 = uVar27;
        if (uVar20 <= uVar27) goto LAB_0012c3bc;
        if (puVar33[uVar27] != '\0') {
          iVar8 = (int)local_80;
          uVar24 = 0;
          do {
            uVar20 = (long)puVar29 - (long)puVar33;
            local_78 = CONCAT44(local_78._4_4_,uVar24);
            uVar25 = uVar27;
            if ((uVar24 & 1) == 0) {
              if (uVar20 <= uVar27) goto LAB_0012c3bc;
              uVar31 = uVar31 + (uint)puVar33[uVar27] * 4;
              puVar23 = &(__return_storage_ptr__->stats).v3_pointer_seeks;
              *puVar23 = *puVar23 + 1;
            }
            else {
              if (uVar20 <= uVar27) goto LAB_0012c3bc;
              if (puVar33[uVar27] != '\0') {
                uVar24 = 0;
                do {
                  puVar23 = &(__return_storage_ptr__->stats).v3_pointers;
                  *puVar23 = *puVar23 + 1;
                  uVar25 = (ulong)uVar31;
                  if (uVar20 <= uVar25) goto LAB_0012c3bc;
                  uVar22 = *(uint *)(puVar33 + uVar25);
                  if (uVar22 < 0x1000000) {
                    puVar23 = &(__return_storage_ptr__->stats).v3_word_pointers;
                    *puVar23 = *puVar23 + 1;
                    bVar6 = LinkedObjectFile::pointer_link_word
                                      (__return_storage_ptr__,iVar7,-iVar8 + uVar31,iVar7,uVar22);
                    if (!bVar6) {
                      printf("WARNING bad pointer_link_word (2) in %s\n",
                             (local_70->_M_dataplus)._M_p);
                    }
                  }
                  else {
                    puVar23 = &(__return_storage_ptr__->stats).v3_split_pointers;
                    *puVar23 = *puVar23 + 1;
                    uVar18 = uVar22 >> 0xc & 0xf;
                    if (uVar18 == 0) {
                      __assert_fail("lo_hi_offset",
                                    "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                                    ,0x2b4,
                                    "void link_v3(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                                   );
                    }
                    uVar9 = uVar22 >> 8 & 0xf;
                    if (2 < uVar9) {
                      __assert_fail("dest_seg < 3",
                                    "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                                    ,0x2b5,
                                    "void link_v3(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                                   );
                    }
                    uVar25 = (ulong)(uVar31 + uVar18 * 4);
                    if (uVar20 <= uVar25) goto LAB_0012c3bc;
                    iVar10 = -iVar8 + uVar31;
                    LinkedObjectFile::pointer_link_split_word
                              (__return_storage_ptr__,iVar7,iVar10,uVar18 * 4 + iVar10,uVar9,
                               (uVar22 & 0xff) << 0x10 | (uint)*(ushort *)(puVar33 + uVar25));
                  }
                  puVar33 = (local_a8->
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                            _M_impl.super__Vector_impl_data._M_start;
                  puVar29 = (local_a8->
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                            _M_impl.super__Vector_impl_data._M_finish;
                  uVar20 = (long)puVar29 - (long)puVar33;
                  uVar25 = uVar27;
                  if (uVar20 <= uVar27) goto LAB_0012c3bc;
                  uVar24 = uVar24 + 1;
                  uVar31 = uVar31 + 4;
                } while (uVar24 < puVar33[uVar27]);
              }
            }
            uVar24 = (int)uVar27 + 1;
            uVar25 = (ulong)uVar24;
            if (puVar33[uVar27] == 0xff) {
              if (uVar20 <= uVar25) goto LAB_0012c3bc;
              bVar6 = puVar33[uVar25] == '\0';
              if (bVar6) {
                uVar25 = (ulong)((int)uVar27 + 2);
              }
            }
            else {
              if (uVar20 <= uVar25) goto LAB_0012c3bc;
              bVar6 = true;
              if (puVar33[uVar25] == '\0') break;
            }
            uVar24 = CONCAT31((int3)(local_78 >> 8),(byte)local_78 ^ bVar6);
            uVar27 = uVar25;
          } while( true );
        }
        uVar14 = (ulong)(uVar24 + 1);
        uVar25 = uVar14;
        if (uVar20 <= uVar14) goto LAB_0012c3bc;
        while( true ) {
          bVar17 = puVar33[uVar14];
          if (bVar17 == 0) break;
          if ((char)bVar17 < '\0') {
            uVar24 = (int)uVar14 + 1;
            uVar14 = (ulong)uVar24;
            uVar25 = (ulong)uVar24;
            if (uVar20 <= uVar25) goto LAB_0012c3bc;
            pTVar16 = get_type_info();
            puVar29 = puVar33 + uVar25;
            local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
            sVar15 = strlen((char *)puVar29);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_a0,puVar29,puVar29 + sVar15);
            TypeInfo::inform_type_method_count(pTVar16,&local_a0,bVar17 & 0x7f);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
              operator_delete(local_a0._M_dataplus._M_p,
                              CONCAT44(local_a0.field_2._M_allocated_capacity._4_4_,
                                       local_a0.field_2._M_allocated_capacity._0_4_) + 1);
            }
            iVar8 = 1;
          }
          else {
            puVar29 = puVar33 + uVar14;
            iVar8 = 2;
          }
          local_a0.field_2._M_allocated_capacity._0_4_ = 0x706d655f;
          local_a0._M_string_length = 7;
          local_a0.field_2._M_allocated_capacity._4_4_ = 0x5f7974;
          local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
          iVar10 = std::__cxx11::string::compare((char *)&local_a0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
            operator_delete(local_a0._M_dataplus._M_p,
                            CONCAT44(local_a0.field_2._M_allocated_capacity._4_4_,
                                     local_a0.field_2._M_allocated_capacity._0_4_) + 1);
          }
          if (iVar10 == 0) {
            iVar8 = 0;
          }
          if (((char)bVar17 < '\0') && (iVar10 == 0)) {
            __assert_fail("kind == SymbolLinkKind::SYMBOL",
                          "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                          ,0x2ec,
                          "void link_v3(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                         );
          }
          sVar15 = strlen((char *)puVar29);
          puVar23 = &(__return_storage_ptr__->stats).v3_symbol_count;
          *puVar23 = *puVar23 + 1;
          pTVar16 = get_type_info();
          std::__cxx11::string::string((string *)&local_a0,(char *)puVar29,&local_a9);
          TypeInfo::inform_symbol_with_no_type_info(pTVar16,&local_a0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
            operator_delete(local_a0._M_dataplus._M_p,
                            CONCAT44(local_a0.field_2._M_allocated_capacity._4_4_,
                                     local_a0.field_2._M_allocated_capacity._0_4_) + 1);
          }
          uVar24 = (int)uVar14 + (int)sVar15 + 1;
          puVar33 = (local_a8->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          puVar19 = (local_a8->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_finish;
          uVar14 = local_80;
          do {
            uVar20 = (long)puVar19 - (long)puVar33;
            do {
              uVar31 = uVar24;
              uVar25 = (ulong)uVar31;
              if (uVar20 <= uVar25) goto LAB_0012c3bc;
              uVar24 = uVar31 + 1;
              uVar22 = (int)uVar14 + (uint)puVar33[uVar25] * 4;
              uVar14 = (ulong)uVar22;
            } while (puVar33[uVar25] == 0xff);
            uVar25 = uVar14;
            if (uVar20 <= uVar14) goto LAB_0012c3bc;
            if (*(int *)(puVar33 + uVar14) == -1) {
              puVar23 = &(__return_storage_ptr__->stats).v3_symbol_link_word;
              *puVar23 = *puVar23 + 1;
              if (iVar8 == 0) {
                kind = EMPTY_PTR;
              }
              else {
                kind = SYM_PTR;
                if (iVar8 == 1) {
                  pTVar16 = get_type_info();
                  std::__cxx11::string::string((string *)&local_a0,(char *)puVar29,&local_a9);
                  TypeInfo::inform_type(pTVar16,&local_a0);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
                    operator_delete(local_a0._M_dataplus._M_p,
                                    CONCAT44(local_a0.field_2._M_allocated_capacity._4_4_,
                                             local_a0.field_2._M_allocated_capacity._0_4_) + 1);
                  }
                  kind = TYPE_PTR;
                }
              }
              LinkedObjectFile::symbol_link_word
                        (__return_storage_ptr__,iVar7,uVar22 - (int)local_80,(char *)puVar29,kind);
            }
            else {
              puVar23 = &(__return_storage_ptr__->stats).v3_symbol_link_offset;
              *puVar23 = *puVar23 + 1;
              if (iVar8 != 2) {
                __assert_fail("kind == SymbolLinkKind::SYMBOL",
                              "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                              ,200,
                              "uint32_t c_symlink3(LinkedObjectFile &, const std::vector<uint8_t> &, uint32_t, uint32_t, SymbolLinkKind, const char *, int)"
                             );
              }
              LinkedObjectFile::symbol_link_offset
                        (__return_storage_ptr__,iVar7,uVar22 - (int)local_80,(char *)puVar29);
            }
            uVar25 = (ulong)uVar24;
            puVar33 = (local_a8->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_start;
            puVar19 = (local_a8->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_finish;
            uVar20 = (long)puVar19 - (long)puVar33;
            if (uVar20 <= uVar25) goto LAB_0012c3bc;
          } while (puVar33[uVar25] != '\0');
          uVar14 = (ulong)(uVar31 + 2);
          uVar25 = uVar14;
          if (uVar20 <= uVar14) goto LAB_0012c3bc;
        }
        local_44[uVar26] = (int)uVar14;
        data = local_a8;
      }
      bVar6 = uVar26 == 0;
      uVar26 = uVar26 - 1;
      if (bVar6) {
        if (local_68[0] != 0x80) {
          __assert_fail("segment_link_offsets[0] == 128",
                        "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                        ,0x2f7,
                        "void link_v3(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                       );
        }
        if (local_38[0x16] == 0) {
          local_44[0] = 0x82;
          if (local_68[1] != 0x82) {
            __assert_fail("segment_link_offsets[0] + 2 == segment_link_offsets[1]",
                          "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                          ,0x2fc,
                          "void link_v3(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                         );
          }
        }
        else {
          local_44[0] = local_44[0] + 1;
          if (local_44[0] != local_68[1]) {
            __assert_fail("segment_link_ends[0] + 1 == segment_link_offsets[1]",
                          "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                          ,0x2fa,
                          "void link_v3(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                         );
          }
        }
        if (local_38[0x1a] == 0) {
          if (local_44[0] + 2 != local_68[2]) {
            __assert_fail("segment_link_offsets[1] + 2 == segment_link_offsets[2]",
                          "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                          ,0x302,
                          "void link_v3(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                         );
          }
        }
        else if (local_44[1] + 1 != local_68[2]) {
          __assert_fail("segment_link_ends[1] + 1 == segment_link_offsets[2]",
                        "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                        ,0x300,
                        "void link_v3(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                       );
        }
        if ((local_44[2] + 0x11U & 0xfffffff0) == local_68[3]) {
          return __return_storage_ptr__;
        }
        __assert_fail("align16(segment_link_ends[2] + 2) == segment_data_offsets[0]",
                      "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                      ,0x305,
                      "void link_v3(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                     );
      }
    } while( true );
  }
  if (*piVar28 != -1) {
    __assert_fail("header->type_tag == 0xffffffff",
                  "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                  ,0x314,
                  "LinkedObjectFile to_linked_object_file(const std::vector<uint8_t> &, const std::string &)"
                 );
  }
  uVar24 = piVar28[3];
  uVar26 = (ulong)uVar24;
  (__return_storage_ptr__->stats).total_code_bytes = uVar24;
  (__return_storage_ptr__->stats).total_v2_code_bytes = uVar24;
  if (uVar20 < 0x11) {
    uVar25 = 0x10;
    goto LAB_0012c3bc;
  }
  uVar24 = uVar24 + 0x10;
  uVar14 = (ulong)uVar24;
  uVar25 = uVar14;
  local_80 = uVar26;
  if (uVar20 <= uVar14) goto LAB_0012c3bc;
  if ((uVar24 & 3) != 0) {
    __assert_fail("((code_end - code_start) % 4) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                  ,0xf3,
                  "void link_v4(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                 );
  }
  LinkedObjectFile::set_segment_count(__return_storage_ptr__,1);
  if (0x10 < uVar24) {
    puVar23 = (uint32_t *)(piVar28 + 4);
    do {
      LinkedObjectFile::push_back_word_to_segment(__return_storage_ptr__,*puVar23,0);
      puVar23 = puVar23 + 1;
    } while (puVar23 < (uint32_t *)((long)piVar28 + uVar14));
  }
  puVar29 = (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Vector_impl_data._M_start;
  puVar33 = (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  uVar20 = (long)puVar33 - (long)puVar29;
  if (uVar20 <= uVar14) goto LAB_0012c3bc;
  if (*(int *)(puVar29 + uVar14) != -1) {
    __assert_fail("link_header_v2->type_tag == 0xffffffff",
                  "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                  ,0xfc,
                  "void link_v4(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                 );
  }
  if (*(int *)(puVar29 + uVar14 + 8) != 2) {
    __assert_fail("link_header_v2->version == 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                  ,0xfd,
                  "void link_v4(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                 );
  }
  if (*(int *)(puVar29 + uVar14 + 4) != piVar28[1]) {
    __assert_fail("link_header_v2->length == header->length",
                  "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                  ,0xfe,
                  "void link_v4(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                 );
  }
  puVar23 = &(__return_storage_ptr__->stats).total_v2_link_bytes;
  *puVar23 = *puVar23 + *(int *)(puVar29 + uVar14 + 4);
  uVar26 = (ulong)((int)local_80 + 0x1c);
  uVar25 = uVar26;
  if (uVar20 <= uVar26) goto LAB_0012c3bc;
  local_50 = (int *)CONCAT44(local_50._4_4_,uVar24);
  puVar19 = puVar29;
  local_78 = uVar14;
  if (puVar29[uVar26] != '\0') {
    uVar24 = 0x10;
    bVar6 = false;
LAB_0012b4c6:
    uVar20 = (long)puVar33 - (long)puVar19;
    uVar25 = uVar26;
    if (uVar26 < uVar20) {
      do {
        bVar17 = puVar19[uVar26];
        iVar7 = (int)uVar26;
        uVar31 = iVar7 + 1;
        if (bVar6) {
          bVar21 = bVar17;
          if (bVar17 == 0) goto LAB_0012b5a6;
          do {
            uVar25 = (ulong)uVar24;
            puVar33 = (local_a8->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_start;
            uVar20 = (long)(local_a8->
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                           _M_impl.super__Vector_impl_data._M_finish - (long)puVar33;
            if (uVar20 <= uVar25) goto LAB_0012c3bc;
            bVar5 = LinkedObjectFile::pointer_link_word
                              (__return_storage_ptr__,0,uVar24 - 0x10,0,*(int *)(puVar33 + uVar25));
            if (!bVar5) {
              printf("WARNING bad link in %s\n");
            }
            puVar23 = &(__return_storage_ptr__->stats).total_v2_pointers;
            *puVar23 = *puVar23 + 1;
            uVar24 = uVar24 + 4;
            bVar21 = bVar21 - 1;
          } while (bVar21 != 0);
          puVar19 = (local_a8->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          puVar33 = (local_a8->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_finish;
        }
        else {
          uVar24 = uVar24 + (uint)bVar17 * 4;
          puVar23 = &(__return_storage_ptr__->stats).total_v2_pointer_seeks;
          *puVar23 = *puVar23 + 1;
        }
        if (bVar17 != 0xff) goto LAB_0012b5a6;
        uVar25 = (ulong)uVar31;
        uVar20 = (long)puVar33 - (long)puVar19;
        if (uVar20 <= uVar25) break;
        if (puVar19[uVar25] == '\0') {
          uVar31 = iVar7 + 2;
        }
        bVar6 = (bool)(bVar6 ^ puVar19[uVar25] == '\0');
        uVar26 = (ulong)uVar31;
        uVar25 = (ulong)uVar31;
        if (uVar20 <= uVar31) break;
      } while( true );
    }
    goto LAB_0012c3bc;
  }
  uVar24 = (int)local_80 + 0x1d;
  goto LAB_0012c144;
LAB_0012b5a6:
  uVar25 = (ulong)uVar31;
  uVar20 = (long)puVar33 - (long)puVar19;
  if (uVar20 <= uVar25) goto LAB_0012c3bc;
  bVar6 = (bool)(bVar6 ^ 1);
  uVar26 = (ulong)uVar31;
  if (puVar19[uVar25] == '\0') goto code_r0x0012b5d1;
  goto LAB_0012b4c6;
code_r0x0012b5d1:
  uVar24 = iVar7 + 2;
  data = local_a8;
LAB_0012c144:
  while (uVar25 = (ulong)uVar24, uVar25 < uVar20) {
    bVar17 = puVar19[uVar25];
    if (bVar17 == 0) {
      if (*(int *)(puVar29 + local_78 + 4) != (uVar24 - (int)local_50 & 0xffffffc0) + 0x40) {
        __assert_fail("link_header_v2->length == align64(link_ptr_offset - link_data_offset + 1)",
                      "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                      ,0x171,
                      "void link_v4(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                     );
      }
      while( true ) {
        if ((ulong)((long)puVar33 - (long)puVar19) <= uVar25) {
          return __return_storage_ptr__;
        }
        uVar24 = uVar24 + 1;
        if (puVar19[uVar25] != '\0') break;
        uVar25 = (ulong)uVar24;
      }
      __assert_fail("data.at(link_ptr_offset) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                    ,0x173,
                    "void link_v4(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                   );
    }
    uVar20 = (long)puVar33 - (long)puVar19;
    if (uVar20 <= uVar25) break;
    if ((char)bVar17 < '\0') {
      uVar24 = uVar24 + 1;
      uVar25 = (ulong)uVar24;
      if (uVar20 <= uVar25) break;
      SVar32 = TYPE;
      if ((bVar17 & 0x7f) != 0) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                      ,0x15f,
                      "void link_v4(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                     );
      }
    }
    else {
      SVar32 = SYMBOL;
      if (bVar17 < 10) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                      ,0x14c,
                      "void link_v4(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                     );
      }
    }
    local_a8 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(puVar19 + uVar25);
    local_a0.field_2._M_allocated_capacity._0_4_ = 0x706d655f;
    local_a0._M_string_length = 7;
    local_a0.field_2._M_allocated_capacity._4_4_ = 0x5f7974;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    iVar7 = std::__cxx11::string::compare((char *)&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,
                      CONCAT44(local_a0.field_2._M_allocated_capacity._4_4_,
                               local_a0.field_2._M_allocated_capacity._0_4_) + 1);
    }
    name_00 = local_a8;
    if (((char)bVar17 < '\0') && (iVar7 == 0)) {
      __assert_fail("kind == SymbolLinkKind::SYMBOL",
                    "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/LinkedObjectFileCreation.cpp"
                    ,0x164,
                    "void link_v4(LinkedObjectFile &, const std::vector<uint8_t> &, const std::string &)"
                   );
    }
    if (iVar7 == 0) {
      SVar32 = EMPTY_LIST;
    }
    sVar15 = strlen((char *)local_a8);
    puVar23 = &(__return_storage_ptr__->stats).total_v2_symbol_count;
    *puVar23 = *puVar23 + 1;
    uVar24 = c_symlink2(__return_storage_ptr__,data,0x10,(int)sVar15 + uVar24 + 1,SVar32,
                        (char *)name_00,0);
    puVar19 = (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_start;
    puVar33 = (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    uVar20 = (long)puVar33 - (long)puVar19;
  }
LAB_0012c3bc:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar25,
             uVar20);
}

Assistant:

LinkedObjectFile to_linked_object_file(const std::vector<uint8_t>& data, const std::string& name) {
  LinkedObjectFile result;
  const auto* header = (const LinkHeaderCommon*)&data.at(0);

  // use appropriate linker
  if (header->version == 3) {
    assert(header->type_tag == 0);
    link_v3(result, data, name);
  } else if (header->version == 4) {
    assert(header->type_tag == 0xffffffff);
    link_v4(result, data, name);
  } else if (header->version == 5) {
    link_v5(result, data, name);
  } else {
    assert(false);
  }

  return result;
}